

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

string_view __thiscall bloaty::RangeSink::TranslateVMToFile(RangeSink *this,uint64_t address)

{
  ulong uVar1;
  bool bVar2;
  size_type __rlen;
  Nonnull<char_*> pcVar3;
  Arg *in_R8;
  string_view sVar4;
  string_view format;
  uint64_t translated;
  ulong local_68;
  string local_60;
  long local_40;
  Nonnull<char_*> local_38;
  char local_30 [32];
  
  if (this->translator_ == (DualMap *)0x0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x55b,"std::string_view bloaty::RangeSink::TranslateVMToFile(uint64_t)");
  }
  bVar2 = RangeMap::Translate(&this->translator_->vm_map,address,&local_68);
  if (bVar2) {
    uVar1 = (this->file_->data_)._M_len;
    sVar4._M_len = uVar1 - local_68;
    if (local_68 <= uVar1) {
      sVar4._M_str = (this->file_->data_)._M_str + local_68;
      return sVar4;
    }
  }
  pcVar3 = absl::numbers_internal::FastIntToBuffer(address,local_30);
  local_40 = (long)pcVar3 - (long)local_30;
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"Can\'t translate VM pointer ($0) to file";
  local_38 = local_30;
  absl::Substitute_abi_cxx11_(&local_60,(absl *)0x27,format,in_R8);
  Throw(local_60._M_dataplus._M_p,0x55f);
}

Assistant:

std::string_view RangeSink::TranslateVMToFile(uint64_t address) {
  assert(translator_);
  uint64_t translated;
  if (!translator_->vm_map.Translate(address, &translated) ||
      translated > file_->data().size()) {
    THROWF("Can't translate VM pointer ($0) to file", address);

  }
  return file_->data().substr(translated);
}